

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sort_tree.hpp
# Opt level: O3

bool __thiscall
duckdb::
MergeSortTree<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long,_std::less<std::tuple<unsigned_long,_unsigned_long>_>,_32UL,_32UL>
::TryNextRun(MergeSortTree<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long,_std::less<std::tuple<unsigned_long,_unsigned_long>_>,_32UL,_32UL>
             *this,idx_t *level_idx,idx_t *run_idx)

{
  pointer ptVar1;
  pointer ptVar2;
  idx_t iVar3;
  int iVar4;
  reference pvVar5;
  ulong uVar6;
  bool bVar7;
  ulong uVar8;
  
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->build_lock);
  if (iVar4 != 0) {
    ::std::__throw_system_error(iVar4);
  }
  uVar8 = this->build_num_runs;
  if ((this->build_complete).super___atomic_base<unsigned_long>._M_i < uVar8) {
    uVar6 = this->build_run;
LAB_011bbf32:
    if (uVar6 < uVar8) {
      *level_idx = (this->build_level).super___atomic_base<unsigned_long>._M_i;
      iVar3 = this->build_run;
      this->build_run = iVar3 + 1;
      *run_idx = iVar3;
      bVar7 = true;
      goto LAB_011bbf55;
    }
  }
  else {
    LOCK();
    (this->build_level).super___atomic_base<unsigned_long>._M_i =
         (this->build_level).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
    if ((this->build_level).super___atomic_base<unsigned_long>._M_i <
        (ulong)(((long)(this->tree).
                       super_vector<std::pair<duckdb::vector<std::tuple<unsigned_long,_unsigned_long>,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<std::tuple<unsigned_long,_unsigned_long>,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
                       .
                       super__Vector_base<std::pair<duckdb::vector<std::tuple<unsigned_long,_unsigned_long>,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<std::tuple<unsigned_long,_unsigned_long>,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->tree).
                       super_vector<std::pair<duckdb::vector<std::tuple<unsigned_long,_unsigned_long>,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<std::tuple<unsigned_long,_unsigned_long>,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
                       .
                       super__Vector_base<std::pair<duckdb::vector<std::tuple<unsigned_long,_unsigned_long>,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<std::tuple<unsigned_long,_unsigned_long>,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555)) {
      pvVar5 = vector<std::pair<duckdb::vector<std::tuple<unsigned_long,_unsigned_long>,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
               ::operator[](&this->tree,0);
      ptVar1 = (pvVar5->first).
               super_vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
               .
               super__Vector_base<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ptVar2 = (pvVar5->first).
               super_vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
               .
               super__Vector_base<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = this->build_run_length * 0x20;
      this->build_run_length = uVar8;
      uVar6 = 0;
      uVar8 = ((uVar8 + ((long)ptVar1 - (long)ptVar2 >> 4)) - 1) / uVar8;
      this->build_num_runs = uVar8;
      this->build_run = 0;
      LOCK();
      (this->build_complete).super___atomic_base<unsigned_long>._M_i = 0;
      UNLOCK();
      goto LAB_011bbf32;
    }
  }
  bVar7 = false;
LAB_011bbf55:
  pthread_mutex_unlock((pthread_mutex_t *)&this->build_lock);
  return bVar7;
}

Assistant:

bool TryNextRun(idx_t &level_idx, idx_t &run_idx) {
		const auto fanout = F;

		lock_guard<mutex> stage_guard(build_lock);

		// Finished with this level?
		if (build_complete >= build_num_runs) {
			++build_level;
			if (build_level >= tree.size()) {
				return false;
			}

			const auto count = LowestLevel().size();
			build_run_length *= fanout;
			build_num_runs = (count + build_run_length - 1) / build_run_length;
			build_run = 0;
			build_complete = 0;
		}

		// If all runs are in flight,
		// yield until the next level is ready
		if (build_run >= build_num_runs) {
			return false;
		}

		level_idx = build_level;
		run_idx = build_run++;

		return true;
	}